

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD3Importer::ReadSkin(MD3Importer *this,SkinData *fill)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string skin_file;
  size_type s;
  SkinData *fill_local;
  MD3Importer *this_local;
  
  skin_file.field_2._8_8_ = std::__cxx11::string::find_last_of((char)this + ' ',0x5f);
  if ((skin_file.field_2._8_8_ == -1) &&
     (skin_file.field_2._8_8_ = std::__cxx11::string::find_last_of((char)this + ' ',0x2e),
     skin_file.field_2._8_8_ == -1)) {
    skin_file.field_2._8_8_ = std::__cxx11::string::size();
  }
  if (skin_file.field_2._8_8_ == -1) {
    __assert_fail("s != std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MD3/MD3Loader.cpp"
                  ,0x1f2,"void Assimp::MD3Importer::ReadSkin(Q3Shader::SkinData &) const");
  }
  std::__cxx11::string::substr((ulong)&local_c0,(ulong)&this->filename);
  std::operator+(&local_a0,&this->path,&local_c0);
  std::operator+(&local_80,&local_a0,"_");
  std::operator+(&local_60,&local_80,&this->configSkinFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,".skin");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  Q3Shader::LoadSkin(fill,(string *)local_40,this->mIOHandler);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void MD3Importer::ReadSkin(Q3Shader::SkinData& fill) const
{
    // skip any postfixes (e.g. lower_1.md3)
    std::string::size_type s = filename.find_last_of('_');
    if (s == std::string::npos) {
        s = filename.find_last_of('.');
        if (s == std::string::npos) {
            s = filename.size();
        }
    }
    ai_assert(s != std::string::npos);

    const std::string skin_file = path + filename.substr(0,s) + "_" + configSkinFile + ".skin";
    Q3Shader::LoadSkin(fill,skin_file,mIOHandler);
}